

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_detach.cpp
# Opt level: O2

unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>,_true> __thiscall
duckdb::Transformer::TransformDetach(Transformer *this,PGDetachStmt *stmt)

{
  OnEntryNotFound OVar1;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> _Var3;
  DetachInfo *in_RAX;
  pointer pDVar4;
  pointer pDVar5;
  long in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  make_uniq<duckdb::DetachStatement>();
  make_uniq<duckdb::DetachInfo>();
  pDVar4 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_28);
  ::std::__cxx11::string::assign((char *)&pDVar4->name);
  OVar1 = *(OnEntryNotFound *)(in_RDX + 0x10);
  pDVar4 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_28);
  pDVar4->if_not_found = OVar1;
  pDVar5 = unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>,_true>::
           operator->((unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>,_true>
                       *)this);
  _Var3._M_head_impl = local_28._M_head_impl;
  local_28._M_head_impl = (DetachInfo *)0x0;
  _Var2._M_head_impl =
       (pDVar5->info).super_unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::DetachInfo_*,_std::default_delete<duckdb::DetachInfo>_>.
       super__Head_base<0UL,_duckdb::DetachInfo_*,_false>._M_head_impl;
  (pDVar5->info).super_unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DetachInfo_*,_std::default_delete<duckdb::DetachInfo>_>.
  super__Head_base<0UL,_duckdb::DetachInfo_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (DetachInfo *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
    if (local_28._M_head_impl != (DetachInfo *)0x0) {
      (*((local_28._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>_>)
         (unique_ptr<duckdb::DetachStatement,_std::default_delete<duckdb::DetachStatement>_>)this;
}

Assistant:

unique_ptr<DetachStatement> Transformer::TransformDetach(duckdb_libpgquery::PGDetachStmt &stmt) {
	auto result = make_uniq<DetachStatement>();
	auto info = make_uniq<DetachInfo>();
	info->name = stmt.db_name;
	info->if_not_found = TransformOnEntryNotFound(stmt.missing_ok);

	result->info = std::move(info);
	return result;
}